

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall Lowerer::GenerateCheckFixedFld(Lowerer *this,Instr *instrChkFld)

{
  InlineCacheIndex IVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 *puVar9;
  SymOpnd *this_00;
  PropertySymOpnd *this_01;
  JITTimeFunctionBody *pJVar10;
  char16 *pcVar11;
  FunctionJITTimeInfo *this_02;
  LabelInstr *labelBailOut;
  LabelInstr *branchTarget;
  BranchInstr *instr;
  BailOutInfo *pBVar12;
  char *this_03;
  Lowerer *this_04;
  WCHAR local_458 [4];
  WCHAR prefixValue [512];
  
  uVar6 = Func::GetSourceContextId(instrChkFld->m_func);
  uVar7 = Func::GetLocalFunctionId(instrChkFld->m_func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,FixedMethodsPhase,uVar6,uVar7);
  if (bVar3) {
    uVar6 = Func::GetSourceContextId(instrChkFld->m_func);
    uVar7 = Func::GetLocalFunctionId(instrChkFld->m_func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,UseFixedDataPropsPhase,uVar6,uVar7);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1894,
                         "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::FixedMethodsPhase)), ((instrChkFld->m_func)->GetSourceContextId()), ((instrChkFld->m_func)->GetLocalFunctionId())) || !Js::Configuration::Global.flags.Off.IsEnabled(((Js::UseFixedDataPropsPhase)), ((instrChkFld->m_func)->GetSourceContextId()), ((instrChkFld->m_func)->GetLocalFunctionId())))"
                         ,"Lowering a check fixed field with fixed data/method phase disabled?");
      if (!bVar3) goto LAB_00546645;
      *puVar9 = 0;
    }
  }
  bVar3 = IR::Opnd::IsSymOpnd(instrChkFld->m_src1);
  if (bVar3) {
    this_00 = IR::Opnd::AsSymOpnd(instrChkFld->m_src1);
    bVar3 = IR::SymOpnd::IsPropertySymOpnd(this_00);
    if (!bVar3) goto LAB_00545fe0;
  }
  else {
LAB_00545fe0:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1896,
                       "(instrChkFld->GetSrc1()->IsSymOpnd() && instrChkFld->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())"
                       ,
                       "instrChkFld->GetSrc1()->IsSymOpnd() && instrChkFld->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd()"
                      );
    if (!bVar3) goto LAB_00546645;
    *puVar9 = 0;
  }
  this_01 = IR::Opnd::AsPropertySymOpnd(instrChkFld->m_src1);
  bVar3 = IR::PropertySymOpnd::TypeCheckSeqBitsSetOnlyIfCandidate(this_01);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1899,"(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate())",
                       "Property sym operand optimized despite not being a candidate?");
    if (!bVar3) goto LAB_00546645;
    *puVar9 = 0;
  }
  bVar3 = IR::PropertySymOpnd::MayNeedTypeCheckProtection(this_01);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x189a,"(propertySymOpnd->MayNeedTypeCheckProtection())",
                       "propertySymOpnd->MayNeedTypeCheckProtection()");
    if (!bVar3) goto LAB_00546645;
    *puVar9 = 0;
  }
  bVar3 = IR::PropertySymOpnd::IsTypeCheckProtected(this_01);
  if ((bVar3) && (this_01->guardedPropOps != (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x189e,
                       "(!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr)"
                       ,
                       "!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr"
                      );
    if (!bVar3) goto LAB_00546645;
    *puVar9 = 0;
  }
  bVar3 = IR::PropertySymOpnd::NeedsPrimaryTypeCheck(this_01);
  bVar4 = IR::PropertySymOpnd::NeedsCheckFixedFieldTypeCheck(this_01);
  if (bVar4) {
    bVar4 = true;
    if (((this_01->field_12).field_0.field_5.typeCheckSeqFlags & 8) != 0) {
      bVar4 = IR::PropertySymOpnd::IsLoadedFromProto(this_01);
    }
  }
  else {
    bVar4 = false;
  }
  Sym::AsPropertySym((this_01->super_SymOpnd).m_sym);
  IVar1 = this_01->m_inlineCacheIndex;
  uVar6 = Func::GetSourceContextId(this->m_func);
  uVar7 = Func::GetLocalFunctionId(this->m_func);
  this_03 = &DAT_01453738;
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,ObjTypeSpecPhase,uVar6,uVar7);
  if (bVar5) {
    pJVar10 = Func::GetJITFunctionBody(this->m_func);
    pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar10);
    pJVar10 = Func::GetJITFunctionBody(this->m_func);
    uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
    this_02 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
    prefixValue._1016_8_ = this;
    pJVar10 = Func::GetJITFunctionBody(this->m_func);
    uVar8 = JITTimeFunctionBody::GetFunctionNumber(pJVar10);
    swprintf_s<512ul>((WCHAR (*) [512])local_458,L"%s (#%d.%u, #%u)",pcVar11,(ulong)uVar6,
                      (ulong)uVar7,(ulong)uVar8);
    Js::OpCodeUtil::GetOpCodeName(instrChkFld->m_opcode);
    if (this_01->guardedPropOps != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      BVSparse<Memory::JitArenaAllocator>::Count(this_01->guardedPropOps);
    }
    this_03 = (char *)0x84;
    Output::TraceWithPrefix
              (ObjTypeSpecPhase,local_458,
               L"Fixed field check: %s, property ID: %d, cache ID: %u, cloned cache: true, layout: %s, redundant check: %s count of props: %u \n"
              );
    this = (Lowerer *)prefixValue._1016_8_;
  }
  if ((bVar3 | bVar4) == 1) {
    labelBailOut = IR::LabelInstr::New(Label,this->m_func,true);
    if (bVar4 != false) {
      bVar3 = IR::PropertySymOpnd::IsRootObjectNonConfigurableFieldLoad(this_01);
      if (bVar3) {
        if ((this_01->guardedPropOps != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
           (bVar3 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(this_01->guardedPropOps), !bVar3))
        {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x18bf,
                             "(!propertySymOpnd->GetGuardedPropOps() || propertySymOpnd->GetGuardedPropOps()->IsEmpty())"
                             ,"This property Guard is used only for one property");
          if (!bVar3) goto LAB_00546645;
          *puVar9 = 0;
        }
        bVar3 = GeneratePropertyGuardCheck(this,instrChkFld,this_01,labelBailOut);
        if (bVar3) goto LAB_0054646f;
        goto LAB_00546629;
      }
      IR::PropertySymOpnd::EnsureGuardedPropOps(this_01,this->m_func->m_alloc);
      uVar6 = IR::PropertySymOpnd::GetObjTypeSpecFldId(this_01);
      IR::PropertySymOpnd::SetGuardedPropOp(this_01,uVar6);
    }
    GenerateCachedTypeCheck(this,instrChkFld,this_01,labelBailOut,labelBailOut,(LabelInstr *)0x0);
LAB_0054646f:
    branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
    instr = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
    IR::Instr::InsertBefore(instrChkFld,&instr->super_Instr);
    IR::Instr::InsertBefore(instrChkFld,&labelBailOut->super_Instr);
    this_04 = (Lowerer *)instrChkFld;
    IR::Instr::InsertAfter(instrChkFld,&branchTarget->super_Instr);
    if (((ushort)this_01->field_12 & 8) != 0) {
      GenerateAuxSlotPtrLoad(this_04,this_01,(branchTarget->super_Instr).m_next);
    }
    if ((instrChkFld->field_0x38 & 0x10) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x190a,"(instrChkFld->HasBailOutInfo())","instrChkFld->HasBailOutInfo()");
      if (!bVar3) {
LAB_00546645:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar9 = 0;
    }
    pBVar12 = IR::Instr::GetBailOutInfo(instrChkFld);
    if (pBVar12->bailOutInstr != instrChkFld) {
      pBVar12 = IR::Instr::GetBailOutInfo(instrChkFld);
      pBVar12->polymorphicCacheIndex = IVar1;
    }
    IR::Instr::FreeSrc1(instrChkFld);
    instrChkFld->m_opcode = BailOut;
    GenerateBailOut(this,instrChkFld,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
  }
  else {
    if (((this_01->field_12).field_0.field_5.typeCheckSeqFlags & 0x40) == 0) {
      uVar6 = Func::GetSourceContextId(this->m_func);
      uVar7 = Func::GetLocalFunctionId(this->m_func);
      this_03 = &DAT_01441eb0;
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,FixedFieldGuardCheckPhase,uVar6,uVar7);
      if (bVar3) {
        labelBailOut = (LabelInstr *)0x0;
        bVar3 = false;
      }
      else {
        labelBailOut = IR::LabelInstr::New(Label,this->m_func,true);
        this_03 = (char *)this;
        bVar3 = GeneratePropertyGuardCheck(this,instrChkFld,this_01,labelBailOut);
      }
    }
    else {
      labelBailOut = (LabelInstr *)0x0;
      bVar3 = false;
    }
    if (((this_01->field_12).field_0.field_5.typeCheckSeqFlags & 0x40) == 0) {
      if (bVar3 != false) goto LAB_0054646f;
    }
    else {
      if (labelBailOut != (LabelInstr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        this_03 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
        ;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x18e7,"(labelBailOut == nullptr)","labelBailOut == nullptr");
        if (!bVar3) goto LAB_00546645;
        *puVar9 = 0;
      }
      if ((instrChkFld->field_0x38 & 0x10) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        this_03 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
        ;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x18e8,"(!instrChkFld->HasBailOutInfo())",
                           "Why does a direct fixed field check have bailout?");
        if (!bVar3) goto LAB_00546645;
        *puVar9 = 0;
      }
      if (((ushort)this_01->field_12 & 8) != 0) {
        GenerateAuxSlotPtrLoad((Lowerer *)this_03,this_01,instrChkFld);
      }
    }
LAB_00546629:
    IR::Instr::Remove(instrChkFld);
  }
  return true;
}

Assistant:

bool
Lowerer::GenerateCheckFixedFld(IR::Instr * instrChkFld)
{
    IR::Instr *instr;
    IR::LabelInstr *labelBailOut = nullptr;
    IR::LabelInstr *labelDone = nullptr;

    AssertMsg(!PHASE_OFF(Js::FixedMethodsPhase, instrChkFld->m_func) ||
        !PHASE_OFF(Js::UseFixedDataPropsPhase, instrChkFld->m_func), "Lowering a check fixed field with fixed data/method phase disabled?");

    Assert(instrChkFld->GetSrc1()->IsSymOpnd() && instrChkFld->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd());
    IR::PropertySymOpnd *propertySymOpnd = instrChkFld->GetSrc1()->AsPropertySymOpnd();

    AssertMsg(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate(), "Property sym operand optimized despite not being a candidate?");
    Assert(propertySymOpnd->MayNeedTypeCheckProtection());

    // In the backwards pass we only add guarded property operations to instructions that are not already
    // protected by an upstream type check.
    Assert(!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr);

    // For the non-configurable properties on the global object we do not need a type check.  Otherwise,
    // we need a type check and bailout here unless this operation is part of the type check sequence and
    // is protected by a type check upstream.
    bool emitPrimaryTypeCheck = propertySymOpnd->NeedsPrimaryTypeCheck();
    // In addition, we may also need a local type check in case the property comes from the prototype and
    // it may have been overwritten on the instance after the primary type check upstream. If the property
    // comes from the instance, we must still protect against its value changing after the type check, but
    // for this a cheaper guard check is sufficient (see below).
    bool emitFixedFieldTypeCheck = propertySymOpnd->NeedsCheckFixedFieldTypeCheck() &&
        (!propertySymOpnd->IsTypeChecked() || propertySymOpnd->IsLoadedFromProto());

    PropertySym * propertySym = propertySymOpnd->m_sym->AsPropertySym();
    uint inlineCacheIndex = propertySymOpnd->m_inlineCacheIndex;
    bool checkFixedDataGenerated = false;
    bool checkFixedTypeGenerated = false;

    OUTPUT_TRACE_FUNC(
        Js::ObjTypeSpecPhase,
        this->m_func,
        _u("Fixed field check: %s, property ID: %d, cache ID: %u, cloned cache: true, layout: %s, redundant check: %s count of props: %u \n"),
        Js::OpCodeUtil::GetOpCodeName(instrChkFld->m_opcode),
        propertySym->m_propertyId,
        inlineCacheIndex, propertySymOpnd->GetCacheLayoutString(), propertySymOpnd->IsTypeChecked() ? _u("true") : _u("false"),
        propertySymOpnd->GetGuardedPropOps() ? propertySymOpnd->GetGuardedPropOps()->Count() : 0);

    if (emitPrimaryTypeCheck || emitFixedFieldTypeCheck)
    {
        labelBailOut = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

        if(emitFixedFieldTypeCheck && propertySymOpnd->IsRootObjectNonConfigurableFieldLoad())
        {
            AssertMsg(!propertySymOpnd->GetGuardedPropOps() || propertySymOpnd->GetGuardedPropOps()->IsEmpty(), "This property Guard is used only for one property");
            //We need only cheaper Guard check, if the property belongs to the GlobalObject.
            checkFixedDataGenerated = this->GenerateFixedFieldGuardCheck(instrChkFld, propertySymOpnd, labelBailOut);
        }
        else
        {
            if (emitFixedFieldTypeCheck)
            {
                propertySymOpnd->EnsureGuardedPropOps(this->m_func->m_alloc);
                propertySymOpnd->SetGuardedPropOp(propertySymOpnd->GetObjTypeSpecFldId());
            }
            this->GenerateCachedTypeCheck(instrChkFld, propertySymOpnd, labelBailOut, labelBailOut);
            checkFixedTypeGenerated = true;
        }
    }

    // We may still need this guard if we didn't emit the write protect type check above. This situation arises if we have
    // a fixed field from the instance (not proto) and a property of the same name has been written somewhere between the
    // primary type check and here. Note that we don't need a type check, because we know the fixed field exists on the
    // object even if it has been written since primary type check, but we need to verify the fixed value didn't get overwritten.
    if (!emitPrimaryTypeCheck && !emitFixedFieldTypeCheck && !propertySymOpnd->IsWriteGuardChecked())
    {
        if (!PHASE_OFF(Js::FixedFieldGuardCheckPhase, this->m_func))
        {
            Assert(labelBailOut == nullptr);
            labelBailOut = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
            checkFixedDataGenerated = this->GenerateFixedFieldGuardCheck(instrChkFld, propertySymOpnd, labelBailOut);
        }
    }

    // Note that a type handler holds only a weak reference to the singleton instance it represents, so
    // it is possible that the instance gets collected before the type and handler do. Hence, the upstream
    // type check may succeed, even as the original instance no longer exists. However, this would happen
    // only if another instance reached the same type (otherwise we wouldn't ever pass the type check
    // upstream). In that case we would have invalidated all fixed fields on that type, and so the type
    // check (or property guard check, if necessary) above would fail. All in all, we would never attempt
    // to access a fixed field from an instance that has been collected.

    if (!emitPrimaryTypeCheck && !emitFixedFieldTypeCheck && propertySymOpnd->IsWriteGuardChecked())
    {
        Assert(labelBailOut == nullptr);
        AssertMsg(!instrChkFld->HasBailOutInfo(), "Why does a direct fixed field check have bailout?");
        if (propertySymOpnd->ProducesAuxSlotPtr())
        {
            this->GenerateAuxSlotPtrLoad(propertySymOpnd, instrChkFld);
        }
        instrChkFld->Remove();
        return true;
    }

    // With lazy bailout, no checks might be generated for CheckFixedFld, so the code in Lowerer is only an
    // unconditional jmp to get past the bailout helper block. This is a new case and is unexpected, so layout
    // phase will also move the statement boundary preceding CheckFixedFld together with the jmp to after
    // function exit. As a result, source mapping is incorrect. Make sure that this doesn't happen by not
    // generating helper blocks at all if we don't generate checks.
    if (!checkFixedDataGenerated && !checkFixedTypeGenerated)
    {
        instrChkFld->Remove();
        return true;
    }

    labelDone = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func);
    instrChkFld->InsertBefore(instr);

    // Insert the helper label here.
    instrChkFld->InsertBefore(labelBailOut);
    instrChkFld->InsertAfter(labelDone);

    if (propertySymOpnd->ProducesAuxSlotPtr())
    {
        this->GenerateAuxSlotPtrLoad(propertySymOpnd, labelDone->m_next);
    }

    // Convert the original instruction to a bailout.
    Assert(instrChkFld->HasBailOutInfo());

    if (instrChkFld->GetBailOutInfo()->bailOutInstr != instrChkFld)
    {
        // Set the cache index in the bailout info so that the bailout code will write it into the
        // bailout record at runtime.
        instrChkFld->GetBailOutInfo()->polymorphicCacheIndex = inlineCacheIndex;
    }

    instrChkFld->FreeSrc1();
    instrChkFld->m_opcode = Js::OpCode::BailOut;
    this->GenerateBailOut(instrChkFld);

    return true;
}